

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

uint64_t filemgr_fetch_prev_header
                   (filemgr *file,uint64_t bid,void *buf,size_t *len,fdb_seqnum_t *seqnum,
                   filemgr_header_revnum_t *revnum,uint64_t *deltasize,uint64_t *version,
                   uint64_t *sb_bmp_revnum,err_log_callback *log_callback)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  fdb_status fVar7;
  void *__src;
  filemgr *pfVar8;
  filemgr_magic_t fVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong *in_RCX;
  void *in_RDX;
  filemgr *in_RSI;
  filemgr *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  ulong *in_stack_00000008;
  ulong *in_stack_00000010;
  ulong *in_stack_00000018;
  err_log_callback *in_stack_00000020;
  bool in_stack_0000003f;
  err_log_callback *in_stack_00000040;
  void *in_stack_00000048;
  bid_t in_stack_00000050;
  filemgr *in_stack_00000058;
  fdb_status fs;
  bid_t latest_hdr;
  int found;
  uint64_t _bmp_revnum;
  uint64_t _deltasize;
  bid_t prev_bid;
  bid_t _prev_bid;
  filemgr_magic_t magic;
  filemgr_header_len_t hdr_len;
  filemgr_header_revnum_t prev_revnum;
  filemgr_header_revnum_t cur_revnum;
  filemgr_header_revnum_t _revnum;
  fdb_seqnum_t _seqnum;
  uint8_t marker [1];
  uint8_t *_buf;
  superblock *in_stack_fffffffffffffee8;
  filemgr *in_stack_fffffffffffffef0;
  ulong local_70;
  filemgr *local_28;
  
  bVar5 = false;
  *in_RCX = 0;
  if (in_RSI == (filemgr *)0x0) {
    return 0;
  }
  if (in_RSI == (filemgr *)0xffffffffffffffff) {
    return 0xffffffffffffffff;
  }
  __src = _filemgr_get_temp_buf();
  fVar7 = filemgr_read(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                       in_stack_0000003f);
  local_28 = in_RSI;
  if (fVar7 == FDB_RESULT_SUCCESS) {
    uVar10 = *(ulong *)((long)__src + ((ulong)in_RDI->blocksize - 9));
    if ((*(char *)((long)__src + ((ulong)in_RDI->blocksize - 1)) == -0x12) &&
       (bVar4 = ver_is_valid_magic(uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8
                                   | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38), bVar4)) {
      uVar6 = *(ushort *)((long)__src + ((ulong)in_RDI->blocksize - 0xb));
      uVar10 = *(ulong *)((long)__src + (long)(int)(uint)(ushort)(uVar6 >> 8 | uVar6 << 8));
      local_70 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                 (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                 (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                 (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
      bVar4 = sb_bmp_exists(in_stack_fffffffffffffee8);
      if ((bVar4) && (uVar11 = (*sb_ops.get_min_live_revnum)(in_RDI), local_70 <= uVar11))
      goto LAB_001438df;
      uVar10 = *(ulong *)((long)__src + ((ulong)in_RDI->blocksize - 0x13));
      local_28 = (filemgr *)
                 (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                  (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                  (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                  (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38);
    }
    else {
      pfVar8 = (filemgr *)filemgr_get_header_bid(in_stack_fffffffffffffef0);
      if ((pfVar8 == (filemgr *)0xffffffffffffffff) || (in_RSI <= pfVar8)) goto LAB_001438df;
      local_70 = (in_RDI->header).revnum + 1;
      local_28 = pfVar8;
    }
    fVar7 = filemgr_read(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                         in_stack_0000003f);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      if (*(char *)((long)__src + ((ulong)in_RDI->blocksize - 1)) == -0x12) {
        uVar10 = *(ulong *)((long)__src + ((ulong)in_RDI->blocksize - 9));
        pfVar8 = (filemgr *)
                 (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                  (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                  (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                  (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38);
        bVar4 = ver_is_valid_magic((filemgr_magic_t)pfVar8);
        if (bVar4) {
          uVar6 = *(ushort *)((long)__src + ((ulong)in_RDI->blocksize - 0xb));
          uVar6 = uVar6 >> 8 | uVar6 << 8;
          if (in_RDX != (void *)0x0) {
            memcpy(in_RDX,__src,(ulong)uVar6);
          }
          uVar10 = *(ulong *)((long)__src + (long)(int)(uint)uVar6);
          uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
          if ((uVar10 < local_70) &&
             (uVar11 = (*sb_ops.get_min_live_revnum)(in_RDI), uVar11 <= uVar10)) {
            uVar2 = *(ulong *)((long)__src + (long)(int)(uint)uVar6 + 8);
            bVar5 = ver_is_atleast_magic_001((filemgr_magic_t)pfVar8);
            if ((bVar5) && (in_stack_00000008 != (ulong *)0x0)) {
              uVar3 = *(ulong *)((long)__src + ((ulong)in_RDI->blocksize - 0x1b));
              *in_stack_00000008 =
                   uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38;
            }
            if ((in_stack_00000018 != (ulong *)0x0) &&
               (bVar5 = ver_superblock_support((filemgr_magic_t)pfVar8), bVar5)) {
              uVar3 = *(ulong *)((long)__src + ((ulong)in_RDI->blocksize - 0x23));
              *in_stack_00000018 =
                   uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38;
            }
            if (in_R9 != (ulong *)0x0) {
              *in_R9 = uVar10;
            }
            *in_R8 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                     (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                     (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                     (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            *in_RCX = (ulong)uVar6;
            *in_stack_00000010 = (ulong)pfVar8;
            bVar5 = true;
          }
        }
        else {
          pcVar1 = in_RDI->filename;
          fVar9 = ver_get_latest_magic();
          fdb_log_impl(in_stack_00000020,3,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_fetch_prev_header",0x577,
                       "A block magic value of %lu of the previous database header block id %lu in a database file \'%s\' does NOT match FILEMGR_MAGIC %lu!"
                       ,pfVar8,local_28,pcVar1,fVar9);
          in_stack_fffffffffffffef0 = pfVar8;
        }
      }
      else if (local_28 != (filemgr *)0x0) {
        in_stack_fffffffffffffef0 = local_28;
        fdb_log_impl(in_stack_00000020,5,FDB_RESULT_FILE_CORRUPTION,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,"filemgr_fetch_prev_header",0x567,
                     "A block marker of the previous database header block id %lu in a database file \'%s\' does NOT match BLK_MARKER_DBHEADER!"
                     ,local_28,in_RDI->filename);
      }
    }
    else {
      in_stack_fffffffffffffef0 = local_28;
      fdb_log_impl(in_stack_00000020,3,(fdb_status)(ulong)(uint)fVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_fetch_prev_header",0x55a,
                   "Failed to read a previous database header with block id %lu in a database file \'%s\'"
                   ,local_28,in_RDI->filename);
    }
  }
LAB_001438df:
  if (!bVar5) {
    *in_RCX = 0;
    local_28 = (filemgr *)0xffffffffffffffff;
  }
  _filemgr_release_temp_buf(in_stack_fffffffffffffef0);
  return (uint64_t)local_28;
}

Assistant:

uint64_t filemgr_fetch_prev_header(struct filemgr *file, uint64_t bid,
                                   void *buf, size_t *len, fdb_seqnum_t *seqnum,
                                   filemgr_header_revnum_t *revnum,
                                   uint64_t *deltasize, uint64_t *version,
                                   uint64_t *sb_bmp_revnum,
                                   err_log_callback *log_callback)
{
    uint8_t *_buf;
    uint8_t marker[BLK_MARKER_SIZE];
    fdb_seqnum_t _seqnum;
    filemgr_header_revnum_t _revnum, cur_revnum, prev_revnum;
    filemgr_header_len_t hdr_len;
    filemgr_magic_t magic;
    bid_t _prev_bid, prev_bid;
    uint64_t _deltasize, _bmp_revnum;
    int found = 0;

    *len = 0;

    if (!bid || bid == BLK_NOT_FOUND) {
        // No other header available
        return bid;
    }
    _buf = (uint8_t *)_filemgr_get_temp_buf();

    // Reverse scan the file for a previous DB header
    do {
        // Get prev_bid from the current header.
        // Since the current header is already cached during the previous
        // operation, no disk I/O will be triggered.
        if (filemgr_read(file, (bid_t)bid, _buf, log_callback, true)
                != FDB_RESULT_SUCCESS) {
            break;
        }

        memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
               BLK_MARKER_SIZE);
        memcpy(&magic,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
               sizeof(magic));
        magic = _endian_decode(magic);

        if (marker[0] != BLK_MARKER_DBHEADER ||
            !ver_is_valid_magic(magic)) {
            // not a header block
            // this happens when this function is invoked between
            // fdb_set() call and fdb_commit() call, so the last block
            // in the file is not a header block
            bid_t latest_hdr = filemgr_get_header_bid(file);
            if (latest_hdr != BLK_NOT_FOUND && bid > latest_hdr) {
                // get the latest header BID
                bid = latest_hdr;
            } else {
                break;
            }
            cur_revnum = file->header.revnum + 1;
        } else {

            memcpy(&hdr_len,
                   _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
                   sizeof(hdr_len), sizeof(hdr_len));
            hdr_len = _endian_decode(hdr_len);

            memcpy(&_revnum, _buf + hdr_len,
                   sizeof(filemgr_header_revnum_t));
            cur_revnum = _endian_decode(_revnum);

            if (sb_bmp_exists(file->sb)) {
                // first check revnum
                if (cur_revnum <= sb_ops.get_min_live_revnum(file)) {
                    // previous headers already have been reclaimed
                    // no more logical prev header
                    break;
                }
            }

            memcpy(&_prev_bid,
                   _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
                       sizeof(hdr_len) - sizeof(_prev_bid),
                   sizeof(_prev_bid));
            prev_bid = _endian_decode(_prev_bid);
            bid = prev_bid;
        }

        // Read the prev header
        fdb_status fs = filemgr_read(file, (bid_t)bid, _buf, log_callback, true);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_WARNING, fs,
                    "Failed to read a previous database header with block id %"
                    _F64 " in "
                    "a database file '%s'", bid, file->filename);
            break;
        }

        memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
               BLK_MARKER_SIZE);
        if (marker[0] != BLK_MARKER_DBHEADER) {
            if (bid) {
                // broken linked list
                fdb_log(log_callback, FDB_LOG_DEBUG, FDB_RESULT_FILE_CORRUPTION,
                        "A block marker of the previous database header block id %"
                        _F64 " in "
                        "a database file '%s' does NOT match BLK_MARKER_DBHEADER!",
                        bid, file->filename);
            }
            break;
        }

        memcpy(&magic,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
               sizeof(magic));
        magic = _endian_decode(magic);
        if (!ver_is_valid_magic(magic)) {
            // broken linked list
            fdb_log(log_callback, FDB_LOG_WARNING, FDB_RESULT_FILE_CORRUPTION,
                    "A block magic value of %" _F64
                    " of the previous database header block id %" _F64 " in "
                    "a database file '%s' does NOT match FILEMGR_MAGIC %"
                    _F64"!", magic,
                    bid, file->filename, ver_get_latest_magic());
            break;
        }

        memcpy(&hdr_len,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
               sizeof(hdr_len), sizeof(hdr_len));
        hdr_len = _endian_decode(hdr_len);

        if (buf) {
            memcpy(buf, _buf, hdr_len);
        }
        memcpy(&_revnum, _buf + hdr_len,
               sizeof(filemgr_header_revnum_t));
        prev_revnum = _endian_decode(_revnum);
        if (prev_revnum >= cur_revnum ||
            prev_revnum < sb_ops.get_min_live_revnum(file)) {
            // no more prev header, or broken linked list
            break;
        }

        memcpy(&_seqnum,
               _buf + hdr_len + sizeof(filemgr_header_revnum_t),
               sizeof(fdb_seqnum_t));
        if (ver_is_atleast_magic_001(magic)) {
            if (deltasize) {
                memcpy(&_deltasize,
                        _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic)
                       - sizeof(hdr_len) - sizeof(prev_bid) - sizeof(_deltasize),
                        sizeof(_deltasize));
                *deltasize = _endian_decode(_deltasize);
            }
        }

        if (sb_bmp_revnum && ver_superblock_support(magic)) {
            memcpy(&_bmp_revnum, _buf + file->blocksize - BLK_MARKER_SIZE
                    - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                    - sizeof(_deltasize) - sizeof(_bmp_revnum), sizeof(_bmp_revnum));
            *sb_bmp_revnum = _endian_decode(_bmp_revnum);
        }

        if (revnum) {
            *revnum = prev_revnum;
        }
        *seqnum = _endian_decode(_seqnum);
        *len = hdr_len;
        *version = magic;
        found = 1;
        break;
    } while (false); // no repetition

    if (!found) { // no other header found till end of file
        *len = 0;
        bid = BLK_NOT_FOUND;
    }

    _filemgr_release_temp_buf(_buf);

    return bid;
}